

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

void dw3_ghost(dw_rom *rom)

{
  ulong in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  ulong in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  ulong in_stack_ffffffffffffffb8;
  
  vpatch(rom,0x13b4,8,0x50,0,0x51,in_stack_ffffffffffffff98 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),0x52),
         in_stack_ffffffffffffffa8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),0x53),
         in_stack_ffffffffffffffb8 & 0xffffffff00000000);
  vpatch(rom,0x13bc,8,0x54,0,0x55,0,0x56,0,0x57,0);
  vpatch(rom,0x13c4,8,0x50,0,0x51,0,0x52,0,0x53,0);
  vpatch(rom,0x13cc,8,0x54,0,0x55,0,0x56,0,0x57,0);
  vpatch(rom,0x13d4,8,0x50,0,0x51,0,0x52,0,0x53,0);
  vpatch(rom,0x13dc,8,0x54,0,0x55,0,0x56,0,0x57,0);
  vpatch(rom,0x13e4,8,0x50,0,0x51,0,0x52,0,0x53,0);
  vpatch(rom,0x13ec,8,0x54,0,0x55,0,0x56,0,0x57,0);
  vpatch(rom,0x13f4,8,0x98,3,0x99,3,0x9a,3,0x9b,3);
  vpatch(rom,0x13fc,8,0x9c,3,0x9d,3,0x9e,3,0x9f,3);
  vpatch(rom,0x14b4,8,0x48,0,0x49,0,0x4a,0,0x4b,0);
  vpatch(rom,0x14bc,8,0x4c,0,0x4d,0,0x4e,0,0x4f,0);
  vpatch(rom,0x14d4,8,0x48,0,0x49,0,0x4a,0,0x4b,0);
  vpatch(rom,0x14dc,8,0x4c,0,0x4d,0,0x4e,0,0x4f,0);
  vpatch(rom,0x14f4,8,0xa8,3,0xa9,3,0xaa,3,0xab,3);
  vpatch(rom,0x14fc,8,0xac,3,0xad,3,0xae,3,0xaf,3);
  vpatch(rom,0x15b4,8,0x30,0,0x31,0,0x32,0,0x33,0);
  vpatch(rom,0x15bc,8,0x34,0,0x35,0,0x36,0,0x37,0);
  vpatch(rom,0x15c4,8,0x30,0,0x31,0,0x32,0,0x33,0);
  vpatch(rom,0x15cc,8,0x34,0,0x35,0,0x36,0,0x37,0);
  vpatch(rom,0x15d4,8,0x30,0,0x31,0,0x32,0,0x33,0);
  vpatch(rom,0x15dc,8,0x34,0,0x35,0,0x36,0,0x37,0);
  vpatch(rom,0x15e4,8,0x30,0,0x31,0,0x32,0,0x33,0);
  vpatch(rom,0x15ec,8,0x34,0,0x35,0,0x36,0,0x37,0);
  vpatch(rom,0x15f4,8,0xb4,3,0xb5,0,0xb2,3,0xb3,3);
  vpatch(rom,0x16b4,8,0x40,0,0x41,0,0x42,0,0x43,0);
  vpatch(rom,0x16bc,8,0x44,0,0x45,0,0x46,0,0x47,0);
  vpatch(rom,0x16c4,8,0x40,0,0x41,0,0x42,0,0x43,0);
  vpatch(rom,0x16cc,8,0x44,0,0x45,0,0x46,0,0x47,0);
  vpatch(rom,0x16d4,8,0x40,0,0x41,0,0x42,0,0x43,0);
  vpatch(rom,0x16dc,8,0x44,0,0x45,0,0x46,0,0x47,0);
  vpatch(rom,0x16e4,8,0x40,0,0x41,0,0x42,0,0x43,0);
  vpatch(rom,0x16ec,8,0x44,0,0x45,0,0x46,0,0x47,0);
  vpatch(rom,0x1704,8,0x38,0,0x39,0,0x3a,3,0x3b,3);
  vpatch(rom,0x1a8b,0xc,0x36,0x30,0x11,0x35,0x27,0x1a,0x35,0x30,0,0x35,0x30,7);
  vpatch(rom,0x12300,0x10,3,4,0xb,0x14,0x14,0x14,0x14,0x2b,3,7,0xf,0x1c,0x1e,0x1e,0x1c,0x3f);
  vpatch(rom,0x12310,0x10,0xc0,0x20,0xd0,0x28,0x28,0x28,0x24,0xda,0xc0,0xe0,0xf0,0x38,0x78,0x78,0x3c
         ,0xfe);
  vpatch(rom,0x12320,0x10,0x5c,0x37,0xb4,0xb4,0x49,0x2e,0x10,0xf,0x7f,0x7f,0xfc,0xfc,0x79,0x3f,0x1f,
         0xf);
  vpatch(rom,0x12330,0x10,0x3d,0xed,0x15,0x12,0x74,0x94,0xf4,8,0xff,0xff,0x1f,0x1e,0x7c,0xfc,0xfc,
         0xf8);
  vpatch(rom,0x12340,0x10,3,4,0xb,0x14,0x14,0x14,0x24,0x5b,3,7,0xf,0x1c,0x1e,0x1e,0x3c,0x7f);
  vpatch(rom,0x12350,0x10,0xc0,0x20,0xd0,0x28,0x28,0x28,0x28,0xd4,0xc0,0xe0,0xf0,0x38,0x78,0x78,0x38
         ,0xfc);
  vpatch(rom,0x12360,0x10,0xbc,0xb7,0xa8,0x48,0x2e,0x29,0x2f,0x10,0xff,0xff,0xf8,0x78,0x3e,0x3f,0x3f
         ,0x1f);
  vpatch(rom,0x12370,0x10,0x3a,0xec,0x2d,0x2d,0x92,0x74,8,0xf0,0xfe,0xfe,0x3f,0x3f,0x9e,0xfc,0xf8,
         0xf0);
  vpatch(rom,0x12400,0x10,3,4,0xb,0x14,0x14,0x14,0x14,0xb,3,7,0xf,0x1c,0x1e,0x1e,0x1c,0xf);
  vpatch(rom,0x12410,0x10,0xc0,0x20,0xd0,0x28,0x28,0x28,0x28,0xd0,0xc0,0xe0,0xf0,0x38,0x38,0x38,0x38
         ,0xf0);
  vpatch(rom,0x12420,0x10,0x14,0x17,0x2a,0x2a,0x29,0x14,0x17,8,0x1f,0x1f,0x3b,0x3b,0x39,0x1c,0x1f,
         0xf);
  vpatch(rom,0x12430,0x10,0x28,0xe8,0xd4,0xd4,0x34,0xe8,0x88,0x70,0xf8,0xf8,0xfc,0xfc,0xfc,0xf8,0xf8
         ,0xf0);
  vpatch(rom,0x12440,0x10,3,4,0xb,0x14,0x14,0x14,0x14,0xb,3,7,0xf,0x1c,0x1e,0x1e,0x1c,0xf);
  vpatch(rom,0x12450,0x10,0xc0,0x20,0xd0,0x28,0x28,0x28,0x28,0xd0,0xc0,0xe0,0xf0,0x38,0x38,0x38,0x38
         ,0xf0);
  vpatch(rom,0x12460,0x10,0x14,0x17,0x2b,0x2b,0x2c,0x17,9,6,0x1f,0x1f,0x3f,0x3f,0x3f,0x1f,0xf,7);
  vpatch(rom,0x12470,0x10,0x28,0xe8,0x54,0x54,0x94,0x14,0xe8,0x10,0xf8,0xf8,0xdc,0xdc,0x9c,0x1c,0xf8
         ,0xf0);
  vpatch(rom,0x12480,0x10,3,4,0xb,0x14,0x14,0x14,0x14,0xb,3,7,0xf,0x1c,0x1c,0x1c,0x1c,0xf);
  vpatch(rom,0x12490,0x10,0xc0,0x20,0xd0,0x28,0x28,0x28,0x28,0xd0,0xc0,0xe0,0xf0,0x38,0x78,0x78,0x38
         ,0xf0);
  vpatch(rom,0x124a0,0x10,0x14,0x17,0x2a,0x2a,0x29,0x28,0x17,8,0x1f,0x1f,0x3b,0x3b,0x39,0x38,0x1f,
         0xf);
  vpatch(rom,0x124b0,0x10,0x28,0xe8,0xd4,0xd4,0x34,0xe8,0x90,0x60,0xf8,0xf8,0xfc,0xfc,0xfc,0xf8,0xf0
         ,0xe0);
  vpatch(rom,0x124c0,0x10,3,4,0xb,0x14,0x14,0x14,0x14,0xb,3,7,0xf,0x1c,0x1c,0x1c,0x1c,0xf);
  vpatch(rom,0x124d0,0x10,0xc0,0x20,0xd0,0x28,0x28,0x28,0x28,0xd0,0xc0,0xe0,0xf0,0x38,0x78,0x78,0x38
         ,0xf0);
  vpatch(rom,0x124e0,0x10,0x14,0x17,0x2b,0x2b,0x2c,0x17,0x11,0xe,0x1f,0x1f,0x3f,0x3f,0x3f,0x1f,0x1f,
         0xf);
  vpatch(rom,0x124f0,0x10,0x28,0xe8,0x54,0x54,0x94,0x28,0xe8,0x10,0xf8,0xf8,0xdc,0xdc,0x9c,0x38,0xf8
         ,0xf0);
  vpatch(rom,0x12500,0x10,3,4,0xb,0x14,0x14,0x14,0x14,0x23,3,7,0xf,0x1c,0x1c,0x1c,0x1c,0x3f);
  vpatch(rom,0x12510,0x10,0xc0,0x20,0xd0,0x28,0x28,0x28,0x28,0xc4,0xc0,0xe0,0xf0,0x38,0x38,0x38,0x38
         ,0xfc);
  vpatch(rom,0x12520,0x10,0x5c,0x37,0xb4,0xb4,0x49,0x2e,0x10,0xf,0x7f,0x7f,0xfc,0xfc,0x79,0x3f,0x1f,
         0xf);
  vpatch(rom,0x12530,0x10,0x3a,0xed,0x15,0x12,0x14,0x94,0xf4,8,0xfe,0xff,0x1f,0x1e,0x1c,0x9c,0xfc,
         0xf8);
  vpatch(rom,0x12540,0x10,3,4,0xb,0x14,0x14,0x14,0x14,0x23,3,7,0xf,0x1c,0x1c,0x1c,0x1c,0x3f);
  vpatch(rom,0x12550,0x10,0xc0,0x20,0xd0,0x28,0x28,0x28,0x28,0xc4,0xc0,0xe0,0xf0,0x38,0x38,0x38,0x38
         ,0xfc);
  vpatch(rom,0x12560,0x10,0x5c,0xb7,0xa8,0x48,0x28,0x29,0x2f,0x10,0x7f,0xff,0xf8,0x78,0x38,0x39,0x3f
         ,0x1f);
  vpatch(rom,0x12570,0x10,0x3a,0xec,0x2d,0x2d,0x92,0x74,8,0xf0,0xfe,0xfe,0x3f,0x3f,0x9e,0xfc,0xf8,
         0xf0);
  vpatch(rom,0x12980,0x10,0,0,0,0,0,0,0,0,0,3,4,8,8,8,8,0x1c);
  vpatch(rom,0x12990,0x10,0x2c,0x1a,199,0xeb,0xef,0xef,0xef,199,0x7c,0xfe,0xff,0xff,0xbf,0xbf,0xb7,
         0xbf);
  vpatch(rom,0x129a0,0x10,0x44,0x93,0x22,0x87,7,0,0,0,0x7f,0xfe,0xff,0xf9,0xff,0x7f,0x3f,0);
  vpatch(rom,0x129b0,0x10,3,0xe4,4,0x10,0x80,0,0,0,0xff,0x1e,0xfa,0xfc,0xf8,8,8,0xf0);
  vpatch(rom,0x129c0,0x10,0,0,0,0,0,0,0,0,0,3,4,8,8,8,8,0x1c);
  vpatch(rom,0x129d0,0x10,0x2c,0x1a,199,0xeb,0xef,0xef,0xef,199,0x7c,0xfe,0xff,0xff,0xbf,0xbf,0xb7,
         0xbf);
  vpatch(rom,0x129e0,0x10,0x44,0x83,0x22,0x47,0x4f,8,4,0x20,0x7f,0xfe,0xff,0xf9,0xff,0x7e,0x3e,0x3f)
  ;
  vpatch(rom,0x129f0,0x10,3,0xe4,0xc,8,0x80,0,0,0,0xff,0x1e,0xfa,0xf2,0xfc,0x88,0xf0,0);
  vpatch(rom,0x12a80,0x10,0,0,0,0,0,0,0,0,0,0x1e,0x21,0x40,0x42,0x42,0x40,0x21);
  vpatch(rom,0x12aa0,0x10,0,0,0,0,0,0,0,0,0x5e,0x40,0x88,0x87,0x80,0x80,0x43,0x3c);
  vpatch(rom,0x12ab0,0x10,0xff,0x7e,0x20,0xfe,0,0,0,0,0xff,0xff,0xdf,0xfe,0xff,0x80,0,0);
  vpatch(rom,0x12ac0,0x10,0,0,0,0,0,0,0,0,0,0x1e,0x21,0x40,0x42,0x42,0x40,0x21);
  vpatch(rom,0x12ae0,0x10,0,0,0,0,0,0,0,0,0x5e,0x40,0x80,0x84,0x83,0x40,0x70,0xf);
  vpatch(rom,0x12af0,0x10,0xff,0x7e,0,0xbe,0,0,0,0,0xff,0xff,0xff,0xfe,0xfe,0xff,0x80,0);
  vpatch(rom,0x12b50,0x10,0,0,0,0,0,0,0,0,0,0xc0,0x20,0x10,0x50,0x50,0x10,0x28);
  vpatch(rom,0x12b60,0x10,0xe3,0x67,0x30,0x18,1,0,0,0,0xfe,0x78,0x1f,0xf,0xf,9,6,0);
  vpatch(rom,0x12b70,0x10,0xe0,0xd0,0x4c,0xe2,0xf2,0x10,0x20,0,0x7c,0x7e,0xff,0x9f,0xff,0xfe,0xfc,
         0x78);
  vpatch(rom,0x12b90,0x10,0,0,0,0,0,0,0,0,0,0x78,0x84,2,0x42,0x42,2,0x84);
  vpatch(rom,0x12ba0,0x10,0x9f,0xe,9,0x1e,0x3e,0,0,0,0xf3,0xff,0xff,0x73,3,3,3,1);
  vpatch(rom,0x12bb0,0x10,0x80,0x60,0x10,0x88,0x48,0x48,0x48,0,0xfc,0xfe,0xfe,0xfe,0xfe,0xfe,0xfc,
         0xe0);
  vpatch(rom,0x12bd0,0x10,0,0,0,0,0,0,0,0,0,0x78,0x84,2,0x42,0x42,2,0x84);
  vpatch(rom,0x12be0,0x10,0x9f,0xe,9,0x1e,0x3e,0,0,0,0xf3,0xff,0xff,0x73,3,3,1,0);
  vpatch(rom,0x12bf0,0x10,0x80,0x70,8,0xc4,0x24,0x2e,0,0,0xfc,0xfe,0xfe,0xfe,0xfe,0xfe,0xa2,0x1c);
  return;
}

Assistant:

static void dw3_ghost(dw_rom *rom)
{
    // sprite table in prg - tile, palette, tile, palette, tile, palette, tile, palette
    vpatch(rom, 0x013b4, 8, 	0x50, 0x00, 0x51, 0x00, 0x52, 0x00, 0x53, 0x00); // player facing up, right extended, no shield, no weapon
    vpatch(rom, 0x013bc, 8, 	0x54, 0x00, 0x55, 0x00, 0x56, 0x00, 0x57, 0x00); // player facing up, left extended, no shield, no weapon
    vpatch(rom, 0x013c4, 8, 	0x50, 0x00, 0x51, 0x00, 0x52, 0x00, 0x53, 0x00); // player facing up, right extended, no shield, weapon
    vpatch(rom, 0x013cc, 8, 	0x54, 0x00, 0x55, 0x00, 0x56, 0x00, 0x57, 0x00); // player facing up, left extended, no shield, weapon
    vpatch(rom, 0x013d4, 8, 	0x50, 0x00, 0x51, 0x00, 0x52, 0x00, 0x53, 0x00); // player facing up, right extended, shield, no weapon
    vpatch(rom, 0x013dc, 8, 	0x54, 0x00, 0x55, 0x00, 0x56, 0x00, 0x57, 0x00); // player facing up, left extended, shield, no weapon
    vpatch(rom, 0x013e4, 8, 	0x50, 0x00, 0x51, 0x00, 0x52, 0x00, 0x53, 0x00); // player facing up, right extended, shield, weapon
    vpatch(rom, 0x013ec, 8, 	0x54, 0x00, 0x55, 0x00, 0x56, 0x00, 0x57, 0x00); // player facing up, left extended, shield, weapon
    vpatch(rom, 0x013f4, 8, 	0x98, 0x03, 0x99, 0x03, 0x9a, 0x03, 0x9b, 0x03); // player facing up, right extended, carrying gwaelin
    vpatch(rom, 0x013fc, 8, 	0x9c, 0x03, 0x9d, 0x03, 0x9e, 0x03, 0x9f, 0x03); // player facing up, left extended, carrying gwaelin

    vpatch(rom, 0x014b4, 8, 	0x48, 0x00, 0x49, 0x00, 0x4a, 0x00, 0x4b, 0x00); // player facing right, foot up, no shield, no weapon
    vpatch(rom, 0x014bc, 8, 	0x4c, 0x00, 0x4d, 0x00, 0x4e, 0x00, 0x4f, 0x00); // player facing right, foot down, no shield, no weapon
    vpatch(rom, 0x014d4, 8, 	0x48, 0x00, 0x49, 0x00, 0x4a, 0x00, 0x4b, 0x00); // player facing right, foot up, shield, no weapon
    vpatch(rom, 0x014dc, 8, 	0x4c, 0x00, 0x4d, 0x00, 0x4e, 0x00, 0x4f, 0x00); // player facing right, foot down, shield, no weapon
    vpatch(rom, 0x014f4, 8, 	0xa8, 0x03, 0xa9, 0x03, 0xaa, 0x03, 0xab, 0x03); // player facing right, foot up, carrying gwaelin
    vpatch(rom, 0x014fc, 8, 	0xac, 0x03, 0xad, 0x03, 0xae, 0x03, 0xaf, 0x03); // player facing right, foot down, carrying gwaelin

    vpatch(rom, 0x015b4, 8, 	0x30, 0x00, 0x31, 0x00, 0x32, 0x00, 0x33, 0x00); // player facing down, right extended, no shield, no weapon
    vpatch(rom, 0x015bc, 8, 	0x34, 0x00, 0x35, 0x00, 0x36, 0x00, 0x37, 0x00); // player facing down, left extended, no shield, no weapon
    vpatch(rom, 0x015c4, 8, 	0x30, 0x00, 0x31, 0x00, 0x32, 0x00, 0x33, 0x00); // player facing down, right extended, no shield, weapon
    vpatch(rom, 0x015cc, 8, 	0x34, 0x00, 0x35, 0x00, 0x36, 0x00, 0x37, 0x00); // player facing down, left extended, no shield, weapon
    vpatch(rom, 0x015d4, 8, 	0x30, 0x00, 0x31, 0x00, 0x32, 0x00, 0x33, 0x00); // player facing down, right extended, shield, no weapon
    vpatch(rom, 0x015dc, 8, 	0x34, 0x00, 0x35, 0x00, 0x36, 0x00, 0x37, 0x00); // player facing down, left extended, shield, no weapon
    vpatch(rom, 0x015e4, 8, 	0x30, 0x00, 0x31, 0x00, 0x32, 0x00, 0x33, 0x00); // player facing down, right extended, shield, weapon
    vpatch(rom, 0x015ec, 8, 	0x34, 0x00, 0x35, 0x00, 0x36, 0x00, 0x37, 0x00); // player facing down, left extended, shield, weapon
    vpatch(rom, 0x015f4, 8, 	0xb4, 0x03, 0xb5, 0x00, 0xb2, 0x03, 0xb3, 0x03); // player facing down, right extended, carrying gwaelin

    vpatch(rom, 0x016b4, 8, 	0x40, 0x00, 0x41, 0x00, 0x42, 0x00, 0x43, 0x00); // player facing left, foot up, no shield, no weapon
    vpatch(rom, 0x016bc, 8, 	0x44, 0x00, 0x45, 0x00, 0x46, 0x00, 0x47, 0x00); // player facing left, foot down, no shield, no weapon
    vpatch(rom, 0x016c4, 8, 	0x40, 0x00, 0x41, 0x00, 0x42, 0x00, 0x43, 0x00); // player facing left, foot up, no shield, weapon
    vpatch(rom, 0x016cc, 8, 	0x44, 0x00, 0x45, 0x00, 0x46, 0x00, 0x47, 0x00); // player facing left, foot down, no shield, weapon
    vpatch(rom, 0x016d4, 8, 	0x40, 0x00, 0x41, 0x00, 0x42, 0x00, 0x43, 0x00); // player facing left, foot up, shield, no weapon
    vpatch(rom, 0x016dc, 8, 	0x44, 0x00, 0x45, 0x00, 0x46, 0x00, 0x47, 0x00); // player facing left, foot down, shield, no weapon
    vpatch(rom, 0x016e4, 8, 	0x40, 0x00, 0x41, 0x00, 0x42, 0x00, 0x43, 0x00); // player facing left, foot up, shield, weapon
    vpatch(rom, 0x016ec, 8, 	0x44, 0x00, 0x45, 0x00, 0x46, 0x00, 0x47, 0x00); // player facing left, foot down, shield, weapon

    vpatch(rom, 0x01704, 8, 	0x38, 0x00, 0x39, 0x00, 0x3a, 0x03, 0x3b, 0x03); // gwaelin facing left, foot up

    // palettes - 4 colours per palette
    vpatch(rom, 0x01a8b, 12, 	0x36, 0x30, 0x11, 0x35, 	0x27, 0x1a, 0x35, 0x30, 	0x00, 0x35, 0x30, 0x07); // "regular sprite" palette

    // sprite data in chr
    vpatch(rom, 0x12300, 16, 	0x03, 0x04, 0x0b, 0x14, 0x14, 0x14, 0x14, 0x2b, 	0x03, 0x07, 0x0f, 0x1c, 0x1e, 0x1e, 0x1c, 0x3f);
    vpatch(rom, 0x12310, 16, 	0xc0, 0x20, 0xd0, 0x28, 0x28, 0x28, 0x24, 0xda, 	0xc0, 0xe0, 0xf0, 0x38, 0x78, 0x78, 0x3c, 0xfe);
    vpatch(rom, 0x12320, 16, 	0x5c, 0x37, 0xb4, 0xb4, 0x49, 0x2e, 0x10, 0x0f, 	0x7f, 0x7f, 0xfc, 0xfc, 0x79, 0x3f, 0x1f, 0x0f);
    vpatch(rom, 0x12330, 16, 	0x3d, 0xed, 0x15, 0x12, 0x74, 0x94, 0xf4, 0x08, 	0xff, 0xff, 0x1f, 0x1e, 0x7c, 0xfc, 0xfc, 0xf8);
    vpatch(rom, 0x12340, 16, 	0x03, 0x04, 0x0b, 0x14, 0x14, 0x14, 0x24, 0x5b, 	0x03, 0x07, 0x0f, 0x1c, 0x1e, 0x1e, 0x3c, 0x7f);
    vpatch(rom, 0x12350, 16, 	0xc0, 0x20, 0xd0, 0x28, 0x28, 0x28, 0x28, 0xd4, 	0xc0, 0xe0, 0xf0, 0x38, 0x78, 0x78, 0x38, 0xfc);
    vpatch(rom, 0x12360, 16, 	0xbc, 0xb7, 0xa8, 0x48, 0x2e, 0x29, 0x2f, 0x10, 	0xff, 0xff, 0xf8, 0x78, 0x3e, 0x3f, 0x3f, 0x1f);
    vpatch(rom, 0x12370, 16, 	0x3a, 0xec, 0x2d, 0x2d, 0x92, 0x74, 0x08, 0xf0, 	0xfe, 0xfe, 0x3f, 0x3f, 0x9e, 0xfc, 0xf8, 0xf0);

    vpatch(rom, 0x12400, 16, 	0x03, 0x04, 0x0b, 0x14, 0x14, 0x14, 0x14, 0x0b, 	0x03, 0x07, 0x0f, 0x1c, 0x1e, 0x1e, 0x1c, 0x0f);
    vpatch(rom, 0x12410, 16, 	0xc0, 0x20, 0xd0, 0x28, 0x28, 0x28, 0x28, 0xd0, 	0xc0, 0xe0, 0xf0, 0x38, 0x38, 0x38, 0x38, 0xf0);
    vpatch(rom, 0x12420, 16, 	0x14, 0x17, 0x2a, 0x2a, 0x29, 0x14, 0x17, 0x08, 	0x1f, 0x1f, 0x3b, 0x3b, 0x39, 0x1c, 0x1f, 0x0f);
    vpatch(rom, 0x12430, 16, 	0x28, 0xe8, 0xd4, 0xd4, 0x34, 0xe8, 0x88, 0x70, 	0xf8, 0xf8, 0xfc, 0xfc, 0xfc, 0xf8, 0xf8, 0xf0);
    vpatch(rom, 0x12440, 16, 	0x03, 0x04, 0x0b, 0x14, 0x14, 0x14, 0x14, 0x0b, 	0x03, 0x07, 0x0f, 0x1c, 0x1e, 0x1e, 0x1c, 0x0f);
    vpatch(rom, 0x12450, 16, 	0xc0, 0x20, 0xd0, 0x28, 0x28, 0x28, 0x28, 0xd0, 	0xc0, 0xe0, 0xf0, 0x38, 0x38, 0x38, 0x38, 0xf0);
    vpatch(rom, 0x12460, 16, 	0x14, 0x17, 0x2b, 0x2b, 0x2c, 0x17, 0x09, 0x06, 	0x1f, 0x1f, 0x3f, 0x3f, 0x3f, 0x1f, 0x0f, 0x07);
    vpatch(rom, 0x12470, 16, 	0x28, 0xe8, 0x54, 0x54, 0x94, 0x14, 0xe8, 0x10, 	0xf8, 0xf8, 0xdc, 0xdc, 0x9c, 0x1c, 0xf8, 0xf0);
    vpatch(rom, 0x12480, 16, 	0x03, 0x04, 0x0b, 0x14, 0x14, 0x14, 0x14, 0x0b, 	0x03, 0x07, 0x0f, 0x1c, 0x1c, 0x1c, 0x1c, 0x0f);
    vpatch(rom, 0x12490, 16, 	0xc0, 0x20, 0xd0, 0x28, 0x28, 0x28, 0x28, 0xd0, 	0xc0, 0xe0, 0xf0, 0x38, 0x78, 0x78, 0x38, 0xf0);
    vpatch(rom, 0x124a0, 16, 	0x14, 0x17, 0x2a, 0x2a, 0x29, 0x28, 0x17, 0x08, 	0x1f, 0x1f, 0x3b, 0x3b, 0x39, 0x38, 0x1f, 0x0f);
    vpatch(rom, 0x124b0, 16, 	0x28, 0xe8, 0xd4, 0xd4, 0x34, 0xe8, 0x90, 0x60, 	0xf8, 0xf8, 0xfc, 0xfc, 0xfc, 0xf8, 0xf0, 0xe0);
    vpatch(rom, 0x124c0, 16, 	0x03, 0x04, 0x0b, 0x14, 0x14, 0x14, 0x14, 0x0b, 	0x03, 0x07, 0x0f, 0x1c, 0x1c, 0x1c, 0x1c, 0x0f);
    vpatch(rom, 0x124d0, 16, 	0xc0, 0x20, 0xd0, 0x28, 0x28, 0x28, 0x28, 0xd0, 	0xc0, 0xe0, 0xf0, 0x38, 0x78, 0x78, 0x38, 0xf0);
    vpatch(rom, 0x124e0, 16, 	0x14, 0x17, 0x2b, 0x2b, 0x2c, 0x17, 0x11, 0x0e, 	0x1f, 0x1f, 0x3f, 0x3f, 0x3f, 0x1f, 0x1f, 0x0f);
    vpatch(rom, 0x124f0, 16, 	0x28, 0xe8, 0x54, 0x54, 0x94, 0x28, 0xe8, 0x10, 	0xf8, 0xf8, 0xdc, 0xdc, 0x9c, 0x38, 0xf8, 0xf0);
    vpatch(rom, 0x12500, 16, 	0x03, 0x04, 0x0b, 0x14, 0x14, 0x14, 0x14, 0x23, 	0x03, 0x07, 0x0f, 0x1c, 0x1c, 0x1c, 0x1c, 0x3f);
    vpatch(rom, 0x12510, 16, 	0xc0, 0x20, 0xd0, 0x28, 0x28, 0x28, 0x28, 0xc4, 	0xc0, 0xe0, 0xf0, 0x38, 0x38, 0x38, 0x38, 0xfc);
    vpatch(rom, 0x12520, 16, 	0x5c, 0x37, 0xb4, 0xb4, 0x49, 0x2e, 0x10, 0x0f, 	0x7f, 0x7f, 0xfc, 0xfc, 0x79, 0x3f, 0x1f, 0x0f);
    vpatch(rom, 0x12530, 16, 	0x3a, 0xed, 0x15, 0x12, 0x14, 0x94, 0xf4, 0x08, 	0xfe, 0xff, 0x1f, 0x1e, 0x1c, 0x9c, 0xfc, 0xf8);
    vpatch(rom, 0x12540, 16, 	0x03, 0x04, 0x0b, 0x14, 0x14, 0x14, 0x14, 0x23, 	0x03, 0x07, 0x0f, 0x1c, 0x1c, 0x1c, 0x1c, 0x3f);
    vpatch(rom, 0x12550, 16, 	0xc0, 0x20, 0xd0, 0x28, 0x28, 0x28, 0x28, 0xc4, 	0xc0, 0xe0, 0xf0, 0x38, 0x38, 0x38, 0x38, 0xfc);
    vpatch(rom, 0x12560, 16, 	0x5c, 0xb7, 0xa8, 0x48, 0x28, 0x29, 0x2f, 0x10, 	0x7f, 0xff, 0xf8, 0x78, 0x38, 0x39, 0x3f, 0x1f);
    vpatch(rom, 0x12570, 16, 	0x3a, 0xec, 0x2d, 0x2d, 0x92, 0x74, 0x08, 0xf0, 	0xfe, 0xfe, 0x3f, 0x3f, 0x9e, 0xfc, 0xf8, 0xf0);

    vpatch(rom, 0x12980, 16,	0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,		0x00, 0x03, 0x04, 0x08, 0x08, 0x08, 0x08, 0x1c);
    vpatch(rom, 0x12990, 16,	0x2c, 0x1a, 0xc7, 0xeb, 0xef, 0xef, 0xef, 0xc7,		0x7c, 0xfe, 0xff, 0xff, 0xbf, 0xbf, 0xb7, 0xbf);
    vpatch(rom, 0x129a0, 16,	0x44, 0x93, 0x22, 0x87, 0x07, 0x00, 0x00, 0x00,		0x7f, 0xfe, 0xff, 0xf9, 0xff, 0x7f, 0x3f, 0x00);
    vpatch(rom, 0x129b0, 16,	0x03, 0xe4, 0x04, 0x10, 0x80, 0x00, 0x00, 0x00,		0xff, 0x1e, 0xfa, 0xfc, 0xf8, 0x08, 0x08, 0xf0);
    vpatch(rom, 0x129c0, 16,	0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,		0x00, 0x03, 0x04, 0x08, 0x08, 0x08, 0x08, 0x1c);
    vpatch(rom, 0x129d0, 16,	0x2c, 0x1a, 0xc7, 0xeb, 0xef, 0xef, 0xef, 0xc7,		0x7c, 0xfe, 0xff, 0xff, 0xbf, 0xbf, 0xb7, 0xbf);
    vpatch(rom, 0x129e0, 16,	0x44, 0x83, 0x22, 0x47, 0x4f, 0x08, 0x04, 0x20,		0x7f, 0xfe, 0xff, 0xf9, 0xff, 0x7e, 0x3e, 0x3f);
    vpatch(rom, 0x129f0, 16,	0x03, 0xe4, 0x0c, 0x08, 0x80, 0x00, 0x00, 0x00,		0xff, 0x1e, 0xfa, 0xf2, 0xfc, 0x88, 0xf0, 0x00);

    vpatch(rom, 0x12a80, 16,	0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,		0x00, 0x1e, 0x21, 0x40, 0x42, 0x42, 0x40, 0x21);

    vpatch(rom, 0x12aa0, 16,	0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,		0x5e, 0x40, 0x88, 0x87, 0x80, 0x80, 0x43, 0x3c);
    vpatch(rom, 0x12ab0, 16,	0xff, 0x7e, 0x20, 0xfe, 0x00, 0x00, 0x00, 0x00,		0xff, 0xff, 0xdf, 0xfe, 0xff, 0x80, 0x00, 0x00);
    vpatch(rom, 0x12ac0, 16,	0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,		0x00, 0x1e, 0x21, 0x40, 0x42, 0x42, 0x40, 0x21);

    vpatch(rom, 0x12ae0, 16,	0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,		0x5e, 0x40, 0x80, 0x84, 0x83, 0x40, 0x70, 0x0f);
    vpatch(rom, 0x12af0, 16,	0xff, 0x7e, 0x00, 0xbe, 0x00, 0x00, 0x00, 0x00,		0xff, 0xff, 0xff, 0xfe, 0xfe, 0xff, 0x80, 0x00);

    vpatch(rom, 0x12b50, 16,	0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,		0x00, 0xc0, 0x20, 0x10, 0x50, 0x50, 0x10, 0x28);
    vpatch(rom, 0x12b60, 16,	0xe3, 0x67, 0x30, 0x18, 0x01, 0x00, 0x00, 0x00,		0xfe, 0x78, 0x1f, 0x0f, 0x0f, 0x09, 0x06, 0x00);
    vpatch(rom, 0x12b70, 16,	0xe0, 0xd0, 0x4c, 0xe2, 0xf2, 0x10, 0x20, 0x00,		0x7c, 0x7e, 0xff, 0x9f, 0xff, 0xfe, 0xfc, 0x78);

    vpatch(rom, 0x12b90, 16,	0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,		0x00, 0x78, 0x84, 0x02, 0x42, 0x42, 0x02, 0x84);
    vpatch(rom, 0x12ba0, 16,	0x9f, 0x0e, 0x09, 0x1e, 0x3e, 0x00, 0x00, 0x00,		0xf3, 0xff, 0xff, 0x73, 0x03, 0x03, 0x03, 0x01);
    vpatch(rom, 0x12bb0, 16,	0x80, 0x60, 0x10, 0x88, 0x48, 0x48, 0x48, 0x00,		0xfc, 0xfe, 0xfe, 0xfe, 0xfe, 0xfe, 0xfc, 0xe0);

    vpatch(rom, 0x12bd0, 16,	0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,		0x00, 0x78, 0x84, 0x02, 0x42, 0x42, 0x02, 0x84);
    vpatch(rom, 0x12be0, 16,	0x9f, 0x0e, 0x09, 0x1e, 0x3e, 0x00, 0x00, 0x00,		0xf3, 0xff, 0xff, 0x73, 0x03, 0x03, 0x01, 0x00);
    vpatch(rom, 0x12bf0, 16,	0x80, 0x70, 0x08, 0xc4, 0x24, 0x2e, 0x00, 0x00,		0xfc, 0xfe, 0xfe, 0xfe, 0xfe, 0xfe, 0xa2, 0x1c);

}